

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj2yaml_Error.cpp
# Opt level: O3

string * __thiscall
(anonymous_namespace)::_obj2yaml_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int ev)

{
  char *pcVar1;
  char *pcVar2;
  
  switch(ev) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Success";
    pcVar1 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "No such file.";
    pcVar1 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Unrecognized file type.";
    pcVar1 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Unsupported object file format.";
    pcVar1 = "";
    break;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Feature not yet implemented.";
    pcVar1 = "";
    break;
  default:
    llvm::llvm_unreachable_internal
              ("An enumerator of obj2yaml_error does not have a message defined.",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/obj2yaml_Error.cpp"
               ,0x2b);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string _obj2yaml_error_category::message(int ev) const {
  switch (static_cast<obj2yaml_error>(ev)) {
  case obj2yaml_error::success:
    return "Success";
  case obj2yaml_error::file_not_found:
    return "No such file.";
  case obj2yaml_error::unrecognized_file_format:
    return "Unrecognized file type.";
  case obj2yaml_error::unsupported_obj_file_format:
    return "Unsupported object file format.";
  case obj2yaml_error::not_implemented:
    return "Feature not yet implemented.";
  }
  llvm_unreachable("An enumerator of obj2yaml_error does not have a message "
                   "defined.");
}